

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
TargetFilesystemArtifactResultCreator<ArtifactPdbTag>::Create_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFilesystemArtifactResultCreator<ArtifactPdbTag> *this,cmTarget *target,
          cmGeneratorExpressionContext *context,GeneratorExpressionContent *content)

{
  _Rb_tree_header *config;
  bool bVar1;
  string pdbSupportVar;
  string language;
  allocator local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  config = &(target->DebugCompatiblePropertiesDone)._M_t._M_impl.super__Rb_tree_header;
  cmTarget::GetLinkerLanguage(&local_50,(cmTarget *)this,(string *)config);
  std::operator+(&local_b0,"CMAKE_",&local_50);
  std::operator+(&local_70,&local_b0,"_LINKER_SUPPORTS_PDB");
  std::__cxx11::string::~string((string *)&local_b0);
  bVar1 = cmMakefile::IsOn(*(cmMakefile **)&(target->DebugCompatiblePropertiesDone)._M_t._M_impl,
                           &local_70);
  if (bVar1) {
    if ((*(uint *)(this + 0x2e0) < 4) && (*(uint *)(this + 0x2e0) != 1)) {
      cmTarget::GetPDBDirectory(__return_storage_ptr__,(cmTarget *)this,(string *)config);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      cmTarget::GetPDBName(&local_b0,(cmTarget *)this,(string *)config);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_b0);
      goto LAB_0030e65d;
    }
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_b0,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string
              ((string *)&local_90,
               "TARGET_PDB_FILE is allowed only for targets with linker created artifacts.",
               &local_b1);
    reportError((cmGeneratorExpressionContext *)target,&local_b0,&local_90);
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_b0,(GeneratorExpressionContent *)context);
    std::__cxx11::string::string
              ((string *)&local_90,"TARGET_PDB_FILE is not supported by the target linker.",
               &local_b1);
    reportError((cmGeneratorExpressionContext *)target,&local_b0,&local_90);
  }
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_0030e65d:
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

static std::string Create(cmTarget* target,
                            cmGeneratorExpressionContext *context,
                            const GeneratorExpressionContent *content)
  {
    std::string language = target->GetLinkerLanguage(context->Config);

    std::string pdbSupportVar = "CMAKE_" + language + "_LINKER_SUPPORTS_PDB";

    if(!context->Makefile->IsOn(pdbSupportVar))
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_PDB_FILE is not supported by the target linker.");
      return std::string();
      }

    cmTarget::TargetType targetType = target->GetType();

    if(targetType != cmTarget::SHARED_LIBRARY &&
       targetType != cmTarget::MODULE_LIBRARY &&
       targetType != cmTarget::EXECUTABLE)
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_PDB_FILE is allowed only for "
                    "targets with linker created artifacts.");
      return std::string();
      }

    std::string result = target->GetPDBDirectory(context->Config);
    result += "/";
    result += target->GetPDBName(context->Config);
    return result;
  }